

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.h
# Opt level: O2

uint8_t find_average(uint8_t *src,int h_start,int h_end,int v_start,int v_end,int stride)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uint8_t *puVar4;
  
  lVar2 = (long)v_start;
  puVar4 = src + stride * lVar2;
  uVar1 = 0;
  for (; lVar3 = (long)h_start, lVar2 < v_end; lVar2 = lVar2 + 1) {
    for (; lVar3 < h_end; lVar3 = lVar3 + 1) {
      uVar1 = uVar1 + puVar4[lVar3];
    }
    puVar4 = puVar4 + stride;
  }
  return (uint8_t)(uVar1 / (ulong)(long)((h_end - h_start) * (v_end - v_start)));
}

Assistant:

static inline uint8_t find_average(const uint8_t *src, int h_start, int h_end,
                                   int v_start, int v_end, int stride) {
  uint64_t sum = 0;
  for (int i = v_start; i < v_end; i++) {
    for (int j = h_start; j < h_end; j++) {
      sum += src[i * stride + j];
    }
  }
  uint64_t avg = sum / ((v_end - v_start) * (h_end - h_start));
  return (uint8_t)avg;
}